

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O1

void emit_restart_e(huff_entropy_ptr entropy,int restart_num)

{
  size_t *psVar1;
  JOCTET *pJVar2;
  j_compress_ptr pjVar3;
  long lVar4;
  
  emit_eobrun(entropy);
  if (entropy->gather_statistics == 0) {
    flush_bits_e(entropy);
    pJVar2 = entropy->next_output_byte;
    entropy->next_output_byte = pJVar2 + 1;
    *pJVar2 = 0xff;
    psVar1 = &entropy->free_in_buffer;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      dump_buffer_e(entropy);
    }
    pJVar2 = entropy->next_output_byte;
    entropy->next_output_byte = pJVar2 + 1;
    *pJVar2 = (char)restart_num + 0xd0;
    psVar1 = &entropy->free_in_buffer;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      dump_buffer_e(entropy);
    }
  }
  pjVar3 = entropy->cinfo;
  if (pjVar3->Ss == 0) {
    if (0 < pjVar3->comps_in_scan) {
      lVar4 = 0;
      do {
        (entropy->saved).last_dc_val[lVar4] = 0;
        lVar4 = lVar4 + 1;
      } while (lVar4 < pjVar3->comps_in_scan);
    }
  }
  else {
    entropy->EOBRUN = 0;
    entropy->BE = 0;
  }
  return;
}

Assistant:

LOCAL(void)
emit_restart_e (huff_entropy_ptr entropy, int restart_num)
{
  int ci;

  emit_eobrun(entropy);

  if (! entropy->gather_statistics) {
    flush_bits_e(entropy);
    emit_byte_e(entropy, 0xFF);
    emit_byte_e(entropy, JPEG_RST0 + restart_num);
  }

  if (entropy->cinfo->Ss == 0) {
    /* Re-initialize DC predictions to 0 */
    for (ci = 0; ci < entropy->cinfo->comps_in_scan; ci++)
      entropy->saved.last_dc_val[ci] = 0;
  } else {
    /* Re-initialize all AC-related fields to 0 */
    entropy->EOBRUN = 0;
    entropy->BE = 0;
  }
}